

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::lts_20240722::strings_internal::BigUnsigned<4>::SetToZero(BigUnsigned<4> *this)

{
  uint local_14;
  BigUnsigned<4> *local_10;
  BigUnsigned<4> *this_local;
  
  local_14 = 0;
  local_10 = this;
  std::fill_n<unsigned_int*,int,unsigned_int>(this->words_,this->size_,&local_14);
  this->size_ = 0;
  return;
}

Assistant:

void SetToZero() {
    std::fill_n(words_, size_, 0u);
    size_ = 0;
  }